

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

bool __thiscall
GLRParser::checkProductionRules
          (GLRParser *this,
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          *possibleParseStacks,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *stack,stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                 *productions,GLRState *currentState,
          set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
          *alreadyReducedStacks,bool final)

{
  Production *this_00;
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  long lVar4;
  pointer pcVar5;
  int *piVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  iterator iVar10;
  _Map_pointer ppbVar11;
  string *psVar12;
  _Base_ptr p_Var13;
  GLRState *currentState_00;
  _Base_ptr p_Var14;
  _Elt_pointer pbVar15;
  int i;
  ulong uVar16;
  byte bVar17;
  _Rb_tree_header *p_Var18;
  bool bVar19;
  string stateName;
  string newVariable;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> newProductions;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperationsb;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newNewStack;
  value_type local_1e0;
  value_type local_1c0;
  _Base_ptr local_1a0;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *local_198;
  vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
  *local_190;
  _Deque_base<Production_*,_std::allocator<Production_*>_> local_188;
  key_type local_138;
  _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  local_e0;
  _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  local_b0;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  
  if (currentState->accepting == true) {
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0._M_impl.super__Rb_tree_header._M_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bVar17 = 0;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var13 = (currentState->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = &(currentState->productions)._M_t._M_impl.super__Rb_tree_header;
    local_198 = productions;
    local_190 = (vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
                 *)possibleParseStacks;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var13 != p_Var18) {
      local_1a0 = &(alreadyReducedStacks->_M_t)._M_impl.super__Rb_tree_header._M_header;
      do {
        this_00 = *(Production **)(p_Var13 + 1);
        pvVar8 = Production::getToP_abi_cxx11_(this_00);
        pvVar9 = Production::getToP_abi_cxx11_(this_00);
        pbVar1 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar2 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        getMarker_abi_cxx11_();
        __n = *(size_t *)((long)pbVar1 + (long)pbVar3 + (-0x18 - (long)pbVar2));
        if (__n == local_188._M_impl.super__Deque_impl_data._M_map_size) {
          if (__n != 0) {
            iVar7 = bcmp(*(void **)((long)pbVar1 + (long)pbVar3 + (-0x20 - (long)pbVar2)),
                         local_188._M_impl.super__Deque_impl_data._M_map,__n);
            if (iVar7 != 0) goto LAB_00123fae;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_138,&stack->c);
          local_138.second = this_00;
          iVar10 = std::
                   _Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
                   ::find(&alreadyReducedStacks->_M_t,&local_138);
          bVar19 = iVar10._M_node == local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_138);
        }
        else {
LAB_00123fae:
          bVar19 = false;
        }
        if ((iterator *)local_188._M_impl.super__Deque_impl_data._M_map !=
            &local_188._M_impl.super__Deque_impl_data._M_start) {
          operator_delete(local_188._M_impl.super__Deque_impl_data._M_map,
                          (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur + 1);
        }
        if (bVar19) {
          ppbVar11 = (_Map_pointer)operator_new(0x18);
          ppbVar11[1] = &this_00->fromP;
          ppbVar11[2] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          psVar12 = Production::getFromP_abi_cxx11_(this_00);
          iVar7 = std::__cxx11::string::compare((char *)psVar12);
          *(uint *)ppbVar11 = (iVar7 == 0) + 2;
          local_138.first.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map = ppbVar11;
          std::
          _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
          ::_M_insert_unique<ParseOperation*>
                    ((_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
                      *)&local_e0,(ParseOperation **)&local_138);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_138,&stack->c);
          local_138.second = this_00;
          std::
          _Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
          ::
          _M_insert_unique<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>
                    ((_Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
                      *)alreadyReducedStacks,&local_138);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_138);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != p_Var18);
      bVar17 = 0;
      if ((_Rb_tree_header *)local_e0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_e0._M_impl.super__Rb_tree_header) {
        p_Var13 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar4 = *(long *)(p_Var13 + 1);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_138,&stack->c);
          std::deque<Production_*,_std::allocator<Production_*>_>::deque
                    ((deque<Production_*,_std::allocator<Production_*>_> *)&local_188,&local_198->c)
          ;
          uVar16 = 0;
          while( true ) {
            pvVar8 = Production::getToP_abi_cxx11_(*(Production **)(lVar4 + 8));
            if (((long)(pvVar8->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar8->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= uVar16) break;
            if (local_138.first.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_138.first.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_138);
              if (local_138.first.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_138.first.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_138);
              }
            }
            uVar16 = uVar16 + 1;
          }
          if (local_138.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_138.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            psVar12 = Production::getFromP_abi_cxx11_(*(Production **)(lVar4 + 8));
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            pcVar5 = (psVar12->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,pcVar5,pcVar5 + psVar12->_M_string_length);
            pbVar15 = local_138.first.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_138.first.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_138.first.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pbVar15 = local_138.first.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
            }
            currentState_00 = findState(this,pbVar15 + -1);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_138,&local_1c0);
            local_80.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map = *(_Map_pointer *)(lVar4 + 8);
            std::deque<Production*,std::allocator<Production*>>::emplace_back<Production*>
                      ((deque<Production*,std::allocator<Production*>> *)&local_188,
                       (Production **)&local_80);
            findParseOptions((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                              *)&local_b0,this,&local_1c0,currentState_00);
            for (p_Var14 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var14 != &local_b0._M_impl.super__Rb_tree_header;
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
              piVar6 = *(int **)(p_Var14 + 1);
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::deque(&local_80.c,
                      (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_138);
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              local_1e0._M_string_length = 0;
              local_1e0.field_2._M_local_buf[0] = '\0';
              if (*piVar6 == 3) {
                std::__cxx11::string::_M_replace((ulong)&local_1e0,0,(char *)0x0,0x14ba92);
                bVar17 = final;
              }
              else {
                std::__cxx11::string::_M_assign((string *)&local_1e0);
              }
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_80.c,&local_1e0);
              std::
              vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
              ::
              emplace_back<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>&>
                        (local_190,&local_80,
                         (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                          *)&local_188);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                         local_1e0.field_2._M_local_buf[0]) + 1);
              }
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~deque(&local_80.c);
            }
            std::
            _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
            ::~_Rb_tree(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_188);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_138);
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != &local_e0._M_impl.super__Rb_tree_header);
      }
    }
    std::
    _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
    ::~_Rb_tree(&local_e0);
  }
  else {
    bVar17 = 0;
  }
  return (bool)(bVar17 & 1);
}

Assistant:

bool
GLRParser::checkProductionRules(
        vector<pair<std::stack<std::string>, std::stack<Production *>>> &possibleParseStacks,
        const std::stack<std::string> &stack,
        const std::stack<Production *> &productions,
        const GLRState *currentState,
        set<pair<std::stack<std::string>, Production *>> &alreadyReducedStacks,
        bool final) {// Check for possible reduces

    bool finalStack = false;
    if (currentState->isAccepting()) {
        // TODO: push production on stack
        set<ParseOperation *> parseOperations;

        // Find the possible reduces
        for (auto prod: currentState->getProductions()) {
            if (prod->getToP()[prod->getToP().size() - 1] == getMarker() &&
                alreadyReducedStacks.find(std::pair<std::stack<std::string>, Production *>(stack, prod)) ==
                alreadyReducedStacks.end()) {
                parseOperations.insert(new ParseOperation(prod));
                alreadyReducedStacks.insert(std::pair<std::stack<std::string>, Production *>(stack, prod));
            }
        }

        for (ParseOperation *parseOperation: parseOperations) {
            std::stack<std::string> newStack = stack;
            std::stack<Production *> newProductions = productions;

            // Pop the left side of the production from the stack
            for (int i = 0; i < parseOperation->getReduceProduction()->getToP().size() - 1; ++i) {
                // pop all elements from the stack (exclude the marker)
                if(!newStack.empty())
                    newStack.pop(); // pop the state marker
                if(!newStack.empty())
                    newStack.pop(); // pop the string element
            }

            if(newStack.empty())
                continue;

            // Push the right side and determine the new top state
            string newVariable = parseOperation->getReduceProduction()->getFromP();
            GLRState *currentTopState = findState(newStack.top());
            newStack.push(newVariable);
            newProductions.push(parseOperation->getReduceProduction());

            set<ParseOperation *> parseOperationsb = findParseOptions(newVariable, currentTopState);

            for (auto stackOp: parseOperationsb) {

                // For every new possible stack, create a new state
                std::stack<string> newNewStack = newStack;
                std::string stateName;
                if (stackOp->getOperationType() == ParseOperation::accept) {
//                    if (!final) {
//                        continue;
//                    }
//                    std::stack<std::string> acceptStack;
//                    acceptStack.push("accept");
//                    possibleParseStacks.emplace_back(acceptStack,
//                                                     newProductions);
                    finalStack = final;
                    stateName = "accept";
                } else {
                    stateName = stackOp->getNewState()->getName();
                }
                newNewStack.push(stateName);
                // Add this to the possibleParseStacks, so it can still be evaluated this round. (because this stack hasn't yet consumed char c)
                possibleParseStacks.emplace_back(newNewStack,
                                                 newProductions); // i (on which we're iterating) mustn't decrease, because we're checking the size & inserting at the end

//                cout << "Reduced, new stack: ";
//                printStack(newNewStack);
//                cout << endl;
            }
        }
    }


    return finalStack;
}